

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throttle.cpp
# Opt level: O2

void throttle_copy(Metric *src,Metric *dst,Duration cooldown_period,Duration chunk_interval)

{
  long lVar1;
  TimeValue tv;
  pointer pTVar2;
  size_t sVar4;
  ostream *poVar5;
  ulong uVar7;
  long lVar8;
  pointer pTVar9;
  TimePoint begin;
  ulong uVar10;
  pair<hta::Clock::time_point,_hta::Clock::time_point> pVar11;
  time_point local_78;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  time_point tVar3;
  time_point tVar6;
  
  pVar11 = hta::Metric::range(src);
  tVar6 = pVar11.second.
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r;
  tVar3 = pVar11.first.
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r;
  sVar4 = hta::Metric::count(src);
  lVar8 = 0;
  uVar7 = 0;
  while (local_78 = pVar11.second.
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r,
        begin.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               pVar11.first.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r,
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <=
        (long)local_78.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
    print_progress((double)((long)begin.
                                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  .__d.__r -
                           (long)tVar3.
                                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 .__d.__r) /
                   (double)((long)tVar6.
                                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  .__d.__r -
                           (long)tVar3.
                                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 .__d.__r));
    hta::Metric::retrieve
              (&data,src,begin,
               (TimePoint)
               ((long)begin.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r + chunk_interval.__r),(IntervalScope)0x1);
    pTVar2 = data.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar9 = data.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    while( true ) {
      pVar11.second.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = local_78.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
      pVar11.first.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            ((long)begin.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r + chunk_interval.__r);
      uVar10 = uVar7 + 1;
      if (pTVar9 == pTVar2) break;
      lVar1 = (pTVar9->time).
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r;
      tv = *pTVar9;
      if ((sVar4 == uVar10) || ((uVar10 / 100000000) * 100000000 - uVar10 == 0)) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar5 = std::operator<<(poVar5," / ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      if (lVar8 < lVar1) {
        if (cooldown_period.__r + lVar8 < lVar1) {
          hta::Metric::insert(dst,tv);
          lVar8 = lVar1;
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Non-Monotonic time ");
        std::ostream::_M_insert<long>((long)poVar5);
        poVar5 = std::operator<<(poVar5," at index ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      pTVar9 = pTVar9 + 1;
      uVar7 = uVar10;
    }
    std::_Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~_Vector_base
              (&data.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>);
  }
  print_progress(1.0);
  poVar5 = std::operator<<((ostream *)&std::cout,"completed, read: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,", written: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void throttle_copy(hta::Metric& src, hta::Metric& dst, hta::Duration cooldown_period,
                   hta::Duration chunk_interval = hta::duration_cast(std::chrono::hours(30 * 24)))
{
    auto total_range = src.range();
    size_t read = 0, written = 0;
    auto count = src.count();
    hta::TimePoint previous_time;
    for (auto t0 = total_range.first; t0 <= total_range.second; t0 += chunk_interval)
    {
        print_progress(static_cast<double>((t0 - total_range.first).count()) /
                       (total_range.second - total_range.first).count());
        auto data = src.retrieve(t0, t0 + chunk_interval, { hta::Scope::closed, hta::Scope::open });
        for (auto tv : data)
        {
            read++;
            if (read % 100000000 == 0 || read == count)
            {
                std::cout << read << " / " << count << std::endl;
            }
            if (tv.time <= previous_time)
            {
                std::cerr << "Non-Monotonic time " << tv.time << " at index " << (read - 1)
                          << std::endl;
                continue;
            }
            if (previous_time + cooldown_period < tv.time)
            {
                previous_time = tv.time;
                dst.insert(tv);
                written++;
            }
        }
    }
    print_progress(1);
    std::cout << "completed, read: " << read << ", written: " << written << std::endl;
}